

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O3

int checkerBig(void)

{
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int n;
  uint local_2c;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    uVar3 = 0;
    do {
      pcVar1 = ScanInt((FILE *)__stream,(int *)&local_2c);
      if (pcVar1 != "PASSED") {
LAB_0010269f:
        fclose(__stream);
        goto LAB_001026a7;
      }
      if ((((int)local_2c < 0) || (1999999 < (int)(local_2c ^ 0x1234567))) ||
         ((bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, uVar4 = local_2c, bVar5 &&
          (uVar4 = uVar3, (int)local_2c <= (int)uVar3)))) {
        printf("wrong output -- ");
        goto LAB_0010269f;
      }
      uVar3 = uVar4;
    } while (iVar2 != -2000000);
    iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar2 == 0) {
      puts("PASSED");
      iVar2 = 0;
    }
    else {
LAB_001026a7:
      puts("FAILED");
      iVar2 = 1;
    }
  }
  testN = testN + 1;
  return iVar2;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1, last = 0;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if ((n^0x1234567) < 0 || 2000000 <= (n^0x1234567)) {
            passed = 0;
            printf("wrong output -- ");
            break;
        } else if (i == 0) {
            last = n;
            continue;
        } else if (n <= last ) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}